

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void CopyInputToRingBuffer(BrotliEncoderState *s,size_t input_size,uint8_t *input_buffer)

{
  uint32_t uVar1;
  int iVar2;
  RingBuffer *pRVar3;
  MemoryManager *m_00;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  size_t local_120;
  size_t local_108;
  MemoryManager *m;
  RingBuffer *ringbuffer_;
  uint8_t *input_buffer_local;
  size_t input_size_local;
  BrotliEncoderState *s_local;
  size_t masked_pos;
  ulong local_90;
  size_t i;
  uint8_t *new_data;
  ulong local_68;
  size_t i_1;
  uint8_t *new_data_1;
  size_t p;
  size_t masked_pos_1;
  
  pRVar3 = &s->ringbuffer_;
  m_00 = &s->memory_manager_;
  iVar2 = EnsureInitialized(s);
  if (iVar2 != 0) {
    if (((s->ringbuffer_).pos_ == 0) && (input_size < (s->ringbuffer_).tail_size_)) {
      (s->ringbuffer_).pos_ = (uint32_t)input_size;
      uVar1 = (s->ringbuffer_).pos_;
      puVar4 = (uint8_t *)BrotliAllocate(m_00,(ulong)(uVar1 + 2) + 7);
      if ((s->ringbuffer_).data_ != (uint8_t *)0x0) {
        memcpy(puVar4,(s->ringbuffer_).data_,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
        BrotliFree(m_00,(s->ringbuffer_).data_);
        (s->ringbuffer_).data_ = (uint8_t *)0x0;
      }
      (s->ringbuffer_).data_ = puVar4;
      (s->ringbuffer_).cur_size_ = uVar1;
      (s->ringbuffer_).buffer_ = (s->ringbuffer_).data_ + 2;
      (s->ringbuffer_).buffer_[-1] = '\0';
      (s->ringbuffer_).buffer_[-2] = '\0';
      for (local_90 = 0; local_90 < 7; local_90 = local_90 + 1) {
        (s->ringbuffer_).buffer_[(s->ringbuffer_).cur_size_ + local_90] = '\0';
      }
      memcpy((s->ringbuffer_).buffer_,input_buffer,input_size);
    }
    else {
      if ((s->ringbuffer_).cur_size_ < (s->ringbuffer_).total_size_) {
        uVar1 = (s->ringbuffer_).total_size_;
        puVar4 = (uint8_t *)BrotliAllocate(m_00,(ulong)(uVar1 + 2) + 7);
        if ((s->ringbuffer_).data_ != (uint8_t *)0x0) {
          memcpy(puVar4,(s->ringbuffer_).data_,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
          BrotliFree(m_00,(s->ringbuffer_).data_);
          (s->ringbuffer_).data_ = (uint8_t *)0x0;
        }
        (s->ringbuffer_).data_ = puVar4;
        (s->ringbuffer_).cur_size_ = uVar1;
        (s->ringbuffer_).buffer_ = (s->ringbuffer_).data_ + 2;
        (s->ringbuffer_).buffer_[-1] = '\0';
        (s->ringbuffer_).buffer_[-2] = '\0';
        for (local_68 = 0; local_68 < 7; local_68 = local_68 + 1) {
          (s->ringbuffer_).buffer_[(s->ringbuffer_).cur_size_ + local_68] = '\0';
        }
        (s->ringbuffer_).buffer_[pRVar3->size_ - 2] = '\0';
        (s->ringbuffer_).buffer_[pRVar3->size_ - 1] = '\0';
      }
      uVar5 = (ulong)((s->ringbuffer_).pos_ & (s->ringbuffer_).mask_);
      uVar6 = (ulong)((s->ringbuffer_).pos_ & (s->ringbuffer_).mask_);
      if (uVar6 < (s->ringbuffer_).tail_size_) {
        local_108 = (s->ringbuffer_).tail_size_ - uVar6;
        if (input_size < local_108) {
          local_108 = input_size;
        }
        memcpy((s->ringbuffer_).buffer_ + pRVar3->size_ + uVar6,input_buffer,local_108);
      }
      if ((ulong)pRVar3->size_ < uVar5 + input_size) {
        local_120 = (s->ringbuffer_).total_size_ - uVar5;
        if (input_size < local_120) {
          local_120 = input_size;
        }
        memcpy((s->ringbuffer_).buffer_ + uVar5,input_buffer,local_120);
        memcpy((s->ringbuffer_).buffer_,input_buffer + (pRVar3->size_ - uVar5),
               input_size - (pRVar3->size_ - uVar5));
      }
      else {
        memcpy((s->ringbuffer_).buffer_ + uVar5,input_buffer,input_size);
      }
      (s->ringbuffer_).buffer_[-2] = (s->ringbuffer_).buffer_[pRVar3->size_ - 2];
      (s->ringbuffer_).buffer_[-1] = (s->ringbuffer_).buffer_[pRVar3->size_ - 1];
      (s->ringbuffer_).pos_ = (uint32_t)input_size + (s->ringbuffer_).pos_;
      if (0x40000000 < (s->ringbuffer_).pos_) {
        (s->ringbuffer_).pos_ = (s->ringbuffer_).pos_ & 0x3fffffff | 0x40000000;
      }
    }
    s->input_pos_ = input_size + s->input_pos_;
    if ((s->ringbuffer_).pos_ <= (s->ringbuffer_).mask_) {
      memset((s->ringbuffer_).buffer_ + (s->ringbuffer_).pos_,0,7);
    }
  }
  return;
}

Assistant:

static void CopyInputToRingBuffer(BrotliEncoderState* s,
                                  const size_t input_size,
                                  const uint8_t* input_buffer) {
  RingBuffer* ringbuffer_ = &s->ringbuffer_;
  MemoryManager* m = &s->memory_manager_;
  if (!EnsureInitialized(s)) return;
  RingBufferWrite(m, input_buffer, input_size, ringbuffer_);
  if (BROTLI_IS_OOM(m)) return;
  s->input_pos_ += input_size;

  /* TL;DR: If needed, initialize 7 more bytes in the ring buffer to make the
     hashing not depend on uninitialized data. This makes compression
     deterministic and it prevents uninitialized memory warnings in Valgrind.
     Even without erasing, the output would be valid (but nondeterministic).

     Background information: The compressor stores short (at most 8 bytes)
     substrings of the input already read in a hash table, and detects
     repetitions by looking up such substrings in the hash table. If it
     can find a substring, it checks whether the substring is really there
     in the ring buffer (or it's just a hash collision). Should the hash
     table become corrupt, this check makes sure that the output is
     still valid, albeit the compression ratio would be bad.

     The compressor populates the hash table from the ring buffer as it's
     reading new bytes from the input. However, at the last few indexes of
     the ring buffer, there are not enough bytes to build full-length
     substrings from. Since the hash table always contains full-length
     substrings, we erase with dummy zeros here to make sure that those
     substrings will contain zeros at the end instead of uninitialized
     data.

     Please note that erasing is not necessary (because the
     memory region is already initialized since he ring buffer
     has a `tail' that holds a copy of the beginning,) so we
     skip erasing if we have already gone around at least once in
     the ring buffer.

     Only clear during the first round of ring-buffer writes. On
     subsequent rounds data in the ring-buffer would be affected. */
  if (ringbuffer_->pos_ <= ringbuffer_->mask_) {
    /* This is the first time when the ring buffer is being written.
       We clear 7 bytes just after the bytes that have been copied from
       the input buffer.

       The ring-buffer has a "tail" that holds a copy of the beginning,
       but only once the ring buffer has been fully written once, i.e.,
       pos <= mask. For the first time, we need to write values
       in this tail (where index may be larger than mask), so that
       we have exactly defined behavior and don't read uninitialized
       memory. Due to performance reasons, hashing reads data using a
       LOAD64, which can go 7 bytes beyond the bytes written in the
       ring-buffer. */
    memset(ringbuffer_->buffer_ + ringbuffer_->pos_, 0, 7);
  }
}